

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdconntable.c
# Opt level: O2

int InsertInStdResConnTable(StdResConnTableEntry_t *elem)

{
  char *s;
  StdResConnTableEntry_t *pSVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  char *__format;
  char *pcVar5;
  StdResConnTableEntry_t *pSVar6;
  
  s = elem->key;
  uVar2 = HashInStdResTbl(s);
  pSVar1 = StdResTblBucket[uVar2];
  if (pSVar1 == (StdResConnTableEntry_t *)0x0) {
    elem->next = (_StdResConnTableEntry *)0x0;
LAB_001261a0:
    StdResTblBucket[uVar2] = elem;
LAB_001261a5:
    iVar3 = 1;
  }
  else {
    iVar3 = strcmp(s,pSVar1->key);
    if (iVar3 < 1) {
      if (iVar3 < 0) {
        elem->next = pSVar1;
        goto LAB_001261a0;
      }
      pcVar4 = elem->value;
      pcVar5 = pSVar1->value;
      __format = "ERROR duplicate key: InsertInStdResConnTable(\"%s\", \"%s\") - old(\"%s\" @%d)\n";
    }
    else {
      do {
        pSVar6 = pSVar1;
        pSVar1 = pSVar6->next;
        if (pSVar1 == (_StdResConnTableEntry *)0x0) goto LAB_00126189;
        iVar3 = strcmp(s,pSVar1->key);
      } while (0 < iVar3);
      if (iVar3 != 0) {
LAB_00126189:
        elem->next = pSVar1;
        pSVar6->next = elem;
        goto LAB_001261a5;
      }
      pcVar4 = elem->value;
      pcVar5 = pSVar1->value;
      __format = "ERROR duplicate key: InsertInStdResConnTable(\"%s\", \"%s\") -- old(\"%s\" @%d)\n"
      ;
    }
    iVar3 = 0;
    fprintf(_stderr,__format,s,pcVar4,pcVar5,(ulong)uVar2);
  }
  return iVar3;
}

Assistant:

int InsertInStdResConnTable(StdResConnTableEntry_t *elem) {
   int r = 0, h = 0, rc = 1;
   StdResConnTableEntry_t *t = NULL;

   h = HashInStdResTbl(elem->key);
   t = StdResTblBucket[h];

   if (t == NULL) {           /* nothing else stored at this h value yet   */
           elem->next = NULL; /* the cdr of the new list is Z              */
      StdResTblBucket[h] = elem; /* store the element at the head of the list */
   }
   else if ((r = strcmp(elem->key, t->key)) > 0) { /* key(e) > key(t), look further down list */

      while (t->next && (r = strcmp(elem->key, t->next->key)) > 0) {
	 t = t->next;
      }

      if ((t->next == NULL) || (r != 0)) { /* hook elem in after t and before t->next */
	 elem->next = t->next;
	    t->next = elem;
      }
      else {
	 fprintf(stderr, "ERROR duplicate key: InsertInStdResConnTable(\"%s\", \"%s\") -- old(\"%s\" @%d)\n",
	       elem->key, elem->value, t->next->value, h);
	 rc = 0;
      }
   }
   else if (r < 0) {       /* the element comes ahead of the first list element */
           elem->next = t;    /* the cdr of the new list is the old list   */
      StdResTblBucket[h] = elem; /* store the element at the head of the list */
   }
   else { /* duplicate */
      fprintf(stderr, "ERROR duplicate key: InsertInStdResConnTable(\"%s\", \"%s\") - old(\"%s\" @%d)\n",
	    elem->key, elem->value, t->value, h);
      rc = 0;
   }
   return rc;
}